

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLib.c
# Opt level: O0

void Abc_NodeStrashUsingNetwork(Abc_Ntk_t *pNtkAig,Abc_Obj_t *pBox)

{
  Abc_Ntk_t *pNtk;
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  bool local_41;
  int local_34;
  int fCompl;
  int i;
  uint *pPolarity;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtkGate;
  Abc_Obj_t *pBox_local;
  Abc_Ntk_t *pNtkAig_local;
  
  iVar2 = Abc_ObjIsBox(pBox);
  if (iVar2 == 0) {
    __assert_fail("Abc_ObjIsBox(pBox)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcLib.c"
                  ,0x174,"void Abc_NodeStrashUsingNetwork(Abc_Ntk_t *, Abc_Obj_t *)");
  }
  pNtk = *(Abc_Ntk_t **)&(pBox->field_5).iData;
  pAVar5 = pBox->pNext;
  iVar2 = Abc_NtkIsNetlist(pNtk);
  if (iVar2 == 0) {
    __assert_fail("Abc_NtkIsNetlist(pNtkGate)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcLib.c"
                  ,0x177,"void Abc_NodeStrashUsingNetwork(Abc_Ntk_t *, Abc_Obj_t *)");
  }
  iVar2 = Abc_NtkLatchNum(pNtk);
  if (iVar2 != 0) {
    __assert_fail("Abc_NtkLatchNum(pNtkGate) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcLib.c"
                  ,0x178,"void Abc_NodeStrashUsingNetwork(Abc_Ntk_t *, Abc_Obj_t *)");
  }
  Abc_NtkCleanCopy(pNtk);
  for (local_34 = 0; iVar2 = Abc_NtkPiNum(pNtk), local_34 < iVar2; local_34 = local_34 + 1) {
    pAVar3 = Abc_NtkPi(pNtk,local_34);
    local_41 = false;
    if (pAVar5 != (Abc_Obj_t *)0x0) {
      iVar2 = Abc_InfoHasBit((uint *)pAVar5,local_34);
      local_41 = iVar2 != 0;
    }
    pAVar4 = Abc_ObjFanin(pBox,local_34);
    pAVar4 = Abc_ObjNotCond((pAVar4->field_6).pCopy,(uint)local_41);
    (pAVar3->field_6).pCopy = pAVar4;
    aVar1 = pAVar3->field_6;
    pAVar3 = Abc_ObjFanout0(pAVar3);
    pAVar3->field_6 = aVar1;
  }
  for (local_34 = 0; iVar2 = Abc_NtkPoNum(pNtk), local_34 < iVar2; local_34 = local_34 + 1) {
    pAVar5 = Abc_NtkPo(pNtk,local_34);
    pAVar3 = Abc_ObjFanin0(pAVar5);
    pAVar3 = Abc_ObjFanin0Ntk(pAVar3);
    Abc_NodeStrashUsingNetwork_rec(pNtkAig,pAVar3);
    pAVar5 = Abc_ObjFanin0(pAVar5);
    aVar1 = pAVar5->field_6;
    pAVar5 = Abc_ObjFanout(pBox,local_34);
    pAVar5->field_6 = aVar1;
  }
  return;
}

Assistant:

void Abc_NodeStrashUsingNetwork( Abc_Ntk_t * pNtkAig, Abc_Obj_t * pBox )
{ 
    Abc_Ntk_t * pNtkGate;
    Abc_Obj_t * pObj;
    unsigned * pPolarity;
    int i, fCompl;
    assert( Abc_ObjIsBox(pBox) );
    pNtkGate = (Abc_Ntk_t *)pBox->pData;
    pPolarity = (unsigned *)pBox->pNext;
    assert( Abc_NtkIsNetlist(pNtkGate) );
    assert( Abc_NtkLatchNum(pNtkGate) == 0 );
    Abc_NtkCleanCopy( pNtkGate );
    // set the PI values
    Abc_NtkForEachPi( pNtkGate, pObj, i )
    {
        fCompl = (pPolarity && Abc_InfoHasBit(pPolarity, i));
        pObj->pCopy = Abc_ObjNotCond( Abc_ObjFanin(pBox,i)->pCopy, fCompl );
        Abc_ObjFanout0(pObj)->pCopy = pObj->pCopy;
    }
    // build recursively and set the PO values
    Abc_NtkForEachPo( pNtkGate, pObj, i )
    {
        Abc_NodeStrashUsingNetwork_rec( pNtkAig, Abc_ObjFanin0Ntk(Abc_ObjFanin0(pObj)) );
        Abc_ObjFanout(pBox,i)->pCopy = Abc_ObjFanin0(pObj)->pCopy;
    }
//printf( "processing %d\n", pBox->Id );
}